

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O1

void handle_a_sequence_aa
               (StringBuffer *current_sequence,double *resolutions,long firstSequenceLength,
               long instance_count,bool ignore_ambigs)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  double dVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  double local_48;
  
  if (0 < firstSequenceLength) {
    pcVar1 = current_sequence->sData;
    lVar6 = 0;
    local_48 = (double)instance_count;
    do {
      plVar4 = resolve_char(pcVar1[lVar6],true,ignore_ambigs);
      if (!ignore_ambigs) {
        local_48 = resolution_count(pcVar1[lVar6],true);
        local_48 = local_48 * (double)instance_count;
      }
      lVar5 = 0;
      do {
        dVar3 = (resolutions + lVar5)[1] + (double)plVar4[lVar5 + 1] * local_48;
        auVar2._8_4_ = SUB84(dVar3,0);
        auVar2._0_8_ = resolutions[lVar5] + (double)plVar4[lVar5] * local_48;
        auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
        *(undefined1 (*) [16])(resolutions + lVar5) = auVar2;
        lVar5 = lVar5 + 2;
      } while (lVar5 != 0x14);
      lVar6 = lVar6 + 1;
      resolutions = resolutions + 0x14;
    } while (lVar6 != firstSequenceLength);
  }
  return;
}

Assistant:

void handle_a_sequence_aa (StringBuffer& current_sequence, double * resolutions, const long firstSequenceLength, long instance_count, bool ignore_ambigs) {
    long resolution_index = 0;
    const unsigned char *s = (const unsigned char *)current_sequence.getString();
    double local_instance_count = instance_count;
    for (long c = 0; c < firstSequenceLength; c++, resolution_index+=20) {
        const long * res = resolve_char(s[c], true, ignore_ambigs);
        if (ignore_ambigs == false) {
          local_instance_count = instance_count * resolution_count(s[c], true);
        }
        for (long k = 0; k < 20; k++) {
          resolutions [resolution_index + k]   += local_instance_count*res[k];
        }
    }
}